

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_gramma_analysis.cpp
# Opt level: O1

compile_errcode __thiscall FunctionCall::Parse(FunctionCall *this)

{
  bool bVar1;
  LogTools *log_tools_ptr;
  SymbolName SVar2;
  compile_errcode cVar3;
  compile_errcode unaff_EBP;
  int iVar4;
  string local_50;
  
  iVar4 = 0;
  do {
    SVar2 = SymbolQueue::GetCurrentName(handle_symbol_queue);
    log_tools_ptr = g_log_tools;
    switch(iVar4) {
    case 0:
      iVar4 = 1;
      if (SVar2 == IDENTIFIER_SYM) goto switchD_0012dc38_default;
      unaff_EBP = -1;
      iVar4 = 0;
      break;
    case 1:
      iVar4 = 2;
      if (SVar2 == L_CIRCLE_BRACKET_SYM) goto switchD_0012dc38_default;
      unaff_EBP = -1;
      iVar4 = 1;
      break;
    case 2:
      cVar3 = ValueArgumentList::Parse(&this->m_value_argument_list);
      if (cVar3 == 0) {
        iVar4 = 3;
        goto switchD_0012dc38_default;
      }
      unaff_EBP = -1;
      iVar4 = 2;
      break;
    case 3:
      iVar4 = 4;
      if (SVar2 == R_CIRCLE_BRACKET_SYM) goto switchD_0012dc38_default;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"expected a \')\' in function call","");
      GrammaErrorLogs(log_tools_ptr,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      unaff_EBP = -1;
      iVar4 = 3;
      break;
    case 4:
      unaff_EBP = 0;
      break;
    default:
switchD_0012dc38_default:
      bVar1 = true;
      if (iVar4 != 3) {
        SymbolQueue::NextSymbol(handle_symbol_queue);
      }
      goto LAB_0012dd0d;
    }
    bVar1 = false;
LAB_0012dd0d:
    if (!bVar1) {
      return unaff_EBP;
    }
  } while( true );
}

Assistant:

compile_errcode FunctionCall::Parse() {
    int ret = COMPILE_OK;
    int state = 0;
    while (true) {
        SymbolName name = handle_symbol_queue->GetCurrentName();
        switch (state) {
            case 0: {
                if (name == IDENTIFIER_SYM) {
                    state = 1;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 1: {
                if (name == L_CIRCLE_BRACKET_SYM) {
                    state = 2;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 2: {
                if ((ret = m_value_argument_list.Parse()) == COMPILE_OK) {
                    state = 3;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 3: {
                if (name == R_CIRCLE_BRACKET_SYM) {
                    state = 4;
                    break;
                } else {
                    GrammaErrorLogs(g_log_tools, "expected a ')' in function call");
                    return NOT_MATCH;
                }
            }
            case 4: return COMPILE_OK;
        }
        if (state != 3)
            handle_symbol_queue->NextSymbol();
    }
}